

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
kratos::get_target_var_name_abi_cxx11_
          (optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,kratos *this,Var *var)

{
  bool bVar1;
  vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
  *this_00;
  __shared_ptr_access<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *peVar2;
  string *psVar3;
  long lVar4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  undefined1 local_90 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> var_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> scope_name;
  size_type pos;
  string *value_str;
  shared_ptr<kratos::Attribute> *attr;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
  *__range1;
  vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
  *attrs;
  Var *var_local;
  
  this_00 = IRNode::get_attributes((IRNode *)this);
  __end1 = std::
           vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
           ::begin(this_00);
  attr = (shared_ptr<kratos::Attribute> *)
         std::
         vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
         ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::shared_ptr<kratos::Attribute>_*,_std::vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>_>
                                *)&attr);
    if (!bVar1) {
      std::
      optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::optional(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    this_01 = (__shared_ptr_access<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<const_std::shared_ptr<kratos::Attribute>_*,_std::vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>_>
              ::operator*(&__end1);
    peVar2 = std::__shared_ptr_access<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_01);
    psVar3 = &peVar2->value_str;
    lVar4 = std::__cxx11::string::rfind((char *)psVar3,0x437b40);
    if (lVar4 == 0) break;
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<kratos::Attribute>_*,_std::vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::rfind((char)psVar3,0x3a);
  std::__cxx11::string::substr((ulong)((long)&var_name.field_2 + 8),(ulong)psVar3);
  std::__cxx11::string::substr((ulong)local_90,(ulong)psVar3);
  std::make_pair<std::__cxx11::string&,std::__cxx11::string&>
            (&local_e0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&var_name.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
  std::
  optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::
  optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
            (__return_storage_ptr__,&local_e0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_e0);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)(var_name.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::pair<std::string, std::string>> get_target_var_name(const Var *var) {
    auto const &attrs = var->get_attributes();
    for (auto const &attr : attrs) {
        auto const &value_str = attr->value_str;
        if (value_str.rfind("ssa=") == 0) {
            auto pos = value_str.rfind(':');
            auto scope_name = value_str.substr(4, pos - 4);
            auto var_name = value_str.substr(pos + 1);
            return std::make_pair(scope_name, var_name);
        }
    }
    return std::nullopt;
}